

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

bool __thiscall
branch_and_reduce_algorithm::folded_vertices_exist(branch_and_reduce_algorithm *this)

{
  long *plVar1;
  int *piVar2;
  int *piVar3;
  vector<int,_std::allocator<int>_> *__range1;
  int iVar4;
  long lVar5;
  bool bVar6;
  vector<int,_std::allocator<int>_> x2;
  vector<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_38,&this->x);
  iVar4 = this->modifiedN + 1;
  lVar5 = (ulong)(uint)this->modifiedN << 4;
  while( true ) {
    iVar4 = iVar4 + -1;
    if (iVar4 < 1) break;
    plVar1 = *(long **)((long)&(this->modifieds).
                               super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].
                               super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       lVar5);
    (**(code **)(*plVar1 + 0x18))(plVar1,&local_38);
    lVar5 = lVar5 + -0x10;
  }
  piVar2 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar6 = false;
  }
  else {
    do {
      piVar3 = piVar2 + 1;
      bVar6 = *piVar2 == 2;
      if (bVar6) break;
      piVar2 = piVar3;
    } while (piVar3 != local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool branch_and_reduce_algorithm::folded_vertices_exist() const
{

    std::vector<int> x2(x);

    for (int i = modifiedN - 1; i >= 0; i--)
    {
        modifieds[i]->reverse(x2);
    }

    for (int const i : x2)
    {
        if (i == 2)
            return true;
    }

    return false;
}